

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

int Ucs2ComputeLengthProc
              (size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
              Col_ClientData clientData)

{
  uint *local_98;
  uint *local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  ulong local_58;
  size_t i;
  uint *puStack_48;
  Col_Char c;
  char *p;
  size_t *lengthPtr;
  Col_ClientData clientData_local;
  Col_RopeChunk *chunks_local;
  size_t number_local;
  size_t length_local;
  size_t index_local;
  
  puStack_48 = (uint *)chunks->data;
  if ((chunks->format == COL_UCS1) || (chunks->format == COL_UCS2)) {
    *(size_t *)clientData = length + *clientData;
  }
  else {
    local_58 = 0;
    while (local_58 < length) {
      if (chunks->format == COL_UCS1) {
        local_5c = (uint)(byte)*puStack_48;
      }
      else {
        if (chunks->format == COL_UCS2) {
          local_60 = (uint)(ushort)*puStack_48;
        }
        else {
          if (chunks->format == COL_UCS4) {
            local_64 = *puStack_48;
          }
          else {
            if (chunks->format == COL_UTF8) {
              local_68 = Col_Utf8Get((Col_Char1 *)puStack_48);
            }
            else {
              if (chunks->format == COL_UTF16) {
                local_6c = Col_Utf16Get((Col_Char2 *)puStack_48);
              }
              else {
                local_6c = 0xffffffff;
              }
              local_68 = local_6c;
            }
            local_64 = local_68;
          }
          local_60 = local_64;
        }
        local_5c = local_60;
      }
      if (local_5c < 0x10000) {
        *(long *)clientData = *clientData + 1;
      }
      local_58 = local_58 + 1;
      if (chunks->format == COL_UCS1) {
        local_78 = (uint *)((long)puStack_48 + 1);
      }
      else {
        if (chunks->format == COL_UCS2) {
          local_80 = (uint *)((long)puStack_48 + 2);
        }
        else {
          if (chunks->format == COL_UCS4) {
            local_88 = puStack_48 + 1;
          }
          else {
            if (chunks->format == COL_UTF8) {
              local_90 = (uint *)Col_Utf8Next((Col_Char1 *)puStack_48);
            }
            else {
              if (chunks->format == COL_UTF16) {
                local_98 = (uint *)Col_Utf16Next((Col_Char2 *)puStack_48);
              }
              else {
                local_98 = (uint *)0x0;
              }
              local_90 = local_98;
            }
            local_88 = local_90;
          }
          local_80 = local_88;
        }
        local_78 = local_80;
      }
      puStack_48 = local_78;
    }
  }
  return 0;
}

Assistant:

static int
Ucs2ComputeLengthProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to the **size_t** length variable to compute. */
    Col_ClientData clientData)
{
    size_t *lengthPtr = (size_t *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    if (chunks->format == COL_UCS1 || chunks->format == COL_UCS2) {
        *lengthPtr += length;
        return 0;
    }
    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        if (c <= COL_CHAR2_MAX) (*lengthPtr)++;
    }
    return 0;
}